

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

void test_read_until_no_buffer(void)

{
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  cio_error err;
  client *client;
  
  ms = (memory_stream *)malloc(0x100);
  iVar1 = memory_stream_init(ms,test_read_until_no_buffer::test_data);
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x474,UNITY_DISPLAY_STYLE_INT);
  read_some_fake.custom_fake = read_some_max;
  dummy_read_handler_fake.custom_fake = save_to_check_buffer;
  cVar2 = cio_buffered_stream_init((cio_buffered_stream *)(ms + 1),(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x479,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_read_until
                    ((cio_buffered_stream *)(ms + 1),(cio_read_buffer *)0x0,"HelloWorld",
                     dummy_read_handler,first_check_buffer);
  UnityAssertEqualNumber
            (-0x16,(long)cVar2,"Return value not correct!",0x47c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x47d,
             UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_close((cio_buffered_stream *)(ms + 1));
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x480,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x481,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_read_until_no_buffer(void)
{
#define PRE_DELIM "MY"
#define DELIM "HelloWorld"
	struct client *client = malloc(sizeof(*client));

	static const char *test_data = PRE_DELIM DELIM "Example";
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, test_data), "Could not allocate memory for test!");
	read_some_fake.custom_fake = read_some_max;
	dummy_read_handler_fake.custom_fake = save_to_check_buffer;

	enum cio_error err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");

	err = cio_buffered_stream_read_until(&client->bs, NULL, DELIM, dummy_read_handler, first_check_buffer);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, dummy_read_handler_fake.call_count, "Handler was not called!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
}